

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

ctmbstr prvTidytidyLocalizedStringN(uint messageType,uint quantity)

{
  ctmbstr ptVar1;
  
  ptVar1 = tidyLocalizedStringImpl(messageType,tidyLanguages.currentLanguage,quantity);
  if (tidyLanguages.fallbackLanguage != (languageDefinition *)0x0 && ptVar1 == (ctmbstr)0x0) {
    ptVar1 = tidyLocalizedStringImpl(messageType,tidyLanguages.fallbackLanguage,quantity);
  }
  if (ptVar1 == (ctmbstr)0x0) {
    ptVar1 = tidyLocalizedStringImpl(messageType,&language_en,quantity);
    if (ptVar1 == (ctmbstr)0x0) {
      ptVar1 = tidyLocalizedStringImpl(messageType,&language_en,1);
      return ptVar1;
    }
  }
  return ptVar1;
}

Assistant:

ctmbstr TY_(tidyLocalizedStringN)( uint messageType, uint quantity )
{
    ctmbstr result;
    
    result  = tidyLocalizedStringImpl( messageType, tidyLanguages.currentLanguage, quantity);
    
    if (!result && tidyLanguages.fallbackLanguage )
    {
        result = tidyLocalizedStringImpl( messageType, tidyLanguages.fallbackLanguage, quantity);
    }
    
    if (!result)
    {
        /* Fallback to en which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, quantity);
    }
    
    if (!result)
    {
        /* Last resort: Fallback to en singular which is built in. */
        result = tidyLocalizedStringImpl( messageType, &language_en, 1);
    }
    
    return result;
}